

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMain.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char **ppcVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  raw_ostream *in_R9;
  StringRef Overview;
  char **local_58 [2];
  StringRef local_48;
  char **local_38;
  char **argv_local;
  int argc_local;
  StringRef *local_20;
  char *local_18;
  char ***local_10;
  
  argv_local._4_4_ = 0;
  local_38 = argv;
  argv_local._0_4_ = argc;
  pcVar4 = getenv("LLVM_PROGRAM_TEST_NO_STACKTRACE_HANDLER");
  if (pcVar4 == (char *)0x0) {
    _argc_local = *local_38;
    local_20 = &local_48;
    local_48.Data = _argc_local;
    if (_argc_local != (char *)0x0) {
      strlen(_argc_local);
    }
    llvm::sys::PrintStackTraceOnErrorSignal(local_48,true);
  }
  testing::InitGoogleMock((int *)&argv_local,local_38);
  uVar2 = (uint)argv_local;
  ppcVar1 = local_38;
  local_10 = local_58;
  local_18 = "";
  local_58[0] = (char **)0x374aba;
  sVar5 = strlen("");
  Overview.Length = 0;
  Overview.Data = (char *)sVar5;
  llvm::cl::ParseCommandLineOptions((cl *)(ulong)uVar2,(int)ppcVar1,local_58[0],Overview,in_R9);
  TestMainArgv0 = *local_38;
  iVar3 = RUN_ALL_TESTS();
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  // Skip setting up signal handlers for tests that need to test things without
  // them configured.
  if (!getenv("LLVM_PROGRAM_TEST_NO_STACKTRACE_HANDLER")) {
    llvm::sys::PrintStackTraceOnErrorSignal(argv[0],
                                            true /* Disable crash reporting */);
  }

  // Initialize both gmock and gtest.
  testing::InitGoogleMock(&argc, argv);

  llvm::cl::ParseCommandLineOptions(argc, argv);

  // Make it easy for a test to re-execute itself by saving argv[0].
  TestMainArgv0 = argv[0];

# if defined(_WIN32)
  // Disable all of the possible ways Windows conspires to make automated
  // testing impossible.
  ::SetErrorMode(SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#   if defined(_MSC_VER)
    ::_set_error_mode(_OUT_TO_STDERR);
    _CrtSetReportMode(_CRT_WARN, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
    _CrtSetReportFile(_CRT_WARN, _CRTDBG_FILE_STDERR);
    _CrtSetReportMode(_CRT_ERROR, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
    _CrtSetReportFile(_CRT_ERROR, _CRTDBG_FILE_STDERR);
    _CrtSetReportMode(_CRT_ASSERT, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
    _CrtSetReportFile(_CRT_ASSERT, _CRTDBG_FILE_STDERR);
#   endif
# endif

  return RUN_ALL_TESTS();
}